

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O0

void __thiscall FSoundSequencePtrArray::~FSoundSequencePtrArray(FSoundSequencePtrArray *this)

{
  uint uVar1;
  FSoundSequence **ppFVar2;
  undefined4 local_14;
  uint i;
  FSoundSequencePtrArray *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<FSoundSequence_*,_FSoundSequence_*>::Size
                      (&this->super_TArray<FSoundSequence_*,_FSoundSequence_*>);
    if (uVar1 <= local_14) break;
    ppFVar2 = TArray<FSoundSequence_*,_FSoundSequence_*>::operator[]
                        (&this->super_TArray<FSoundSequence_*,_FSoundSequence_*>,(ulong)local_14);
    M_Free(*ppFVar2);
    local_14 = local_14 + 1;
  }
  TArray<FSoundSequence_*,_FSoundSequence_*>::~TArray
            (&this->super_TArray<FSoundSequence_*,_FSoundSequence_*>);
  return;
}

Assistant:

~FSoundSequencePtrArray()
	{
		for (unsigned int i = 0; i < Size(); ++i)
		{
			M_Free((*this)[i]);
		}
	}